

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4xor.hpp
# Opt level: O0

bool trng::operator==(status_type *a,status_type *b)

{
  uint uVar1;
  long in_RSI;
  long in_RDI;
  uint i;
  uint local_1c;
  bool local_1;
  
  if (*(int *)(in_RDI + 0x1000) == *(int *)(in_RSI + 0x1000)) {
    for (local_1c = 0; uVar1 = lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U>::status_type::size()
        , local_1c < uVar1; local_1c = local_1c + 1) {
      if (*(int *)(in_RDI + (ulong)local_1c * 4) != *(int *)(in_RSI + (ulong)local_1c * 4)) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool operator==(const status_type &a, const status_type &b) {
        if (a.index != b.index)
          return false;
        for (unsigned int i{0}; i < a.size(); ++i)
          if (a.r[i] != b.r[i])
            return false;
        return true;
      }